

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_debugger_type_*const_&,_const_debugger_type_*const_&> * __thiscall
Catch::ExprLhs<debugger_type_const*const&>::operator==
          (BinaryExpr<const_debugger_type_*const_&,_const_debugger_type_*const_&>
           *__return_storage_ptr__,ExprLhs<debugger_type_const*const&> *this,debugger_type **rhs)

{
  debugger_type **lhs;
  bool comparisonResult;
  StringRef local_30;
  debugger_type **local_20;
  debugger_type **rhs_local;
  ExprLhs<const_debugger_type_*const_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (debugger_type **)this;
  this_local = (ExprLhs<const_debugger_type_*const_&> *)__return_storage_ptr__;
  comparisonResult =
       compareEqual<debugger_type_const*,debugger_type_const*>(*(debugger_type ***)this,rhs);
  lhs = *(debugger_type ***)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<const_debugger_type_*const_&,_const_debugger_type_*const_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }